

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O0

err_t EnumDir(filestream *p,tchar_t *Exts,bool_t ExtFilter,streamdir *Item)

{
  datetime_t dVar1;
  int iVar2;
  bool bVar3;
  undefined1 local_1c8 [8];
  stat file_stats;
  tchar_t FilePath [256];
  dirent *Dirent;
  streamdir *Item_local;
  bool_t ExtFilter_local;
  tchar_t *Exts_local;
  filestream *p_local;
  
  if (p->FindDir == (DIR *)0x0) {
    p_local = (filestream *)0xfffffffffffffff7;
  }
  else {
    Item->FileName[0] = '\0';
    Item->Size = -1;
    while( true ) {
      bVar3 = false;
      if (Item->FileName[0] == '\0') {
        FilePath._248_8_ = readdir64((DIR *)p->FindDir);
        bVar3 = (dirent64 *)FilePath._248_8_ != (dirent64 *)0x0;
      }
      if (!bVar3) break;
      if (*(char *)(FilePath._248_8_ + 0x13) != '.') {
        tcscpy_s((tchar_t *)(file_stats.__glibc_reserved + 2),0x100,p->DirPath);
        tcscat_s((tchar_t *)(file_stats.__glibc_reserved + 2),0x100,
                 (tchar_t *)(FilePath._248_8_ + 0x13));
        tcscpy_s(Item->FileName,0x100,(tchar_t *)(FilePath._248_8_ + 0x13));
        stat64((char *)(file_stats.__glibc_reserved + 2),(stat64 *)local_1c8);
        dVar1 = LinuxToDateTime(file_stats.st_atim.tv_nsec);
        Item->ModifiedDate = dVar1;
        if (((uint)file_stats.st_nlink & 0xf000) == 0x4000) {
          Item->Type = 0x44;
          Item->Size = -1;
        }
        else {
          Item->Size = file_stats.st_rdev;
          iVar2 = CheckExts(Item->FileName,Exts);
          Item->Type = iVar2;
          if ((Item->Type == 0) && (ExtFilter != 0)) {
            Item->FileName[0] = '\0';
          }
        }
      }
    }
    if (Item->FileName[0] == '\0') {
      closedir((DIR *)p->FindDir);
      p->FindDir = (DIR *)0x0;
      p_local = (filestream *)0xfffffffffffffff7;
    }
    else {
      p_local = (filestream *)0x0;
    }
  }
  return (err_t)p_local;
}

Assistant:

static err_t EnumDir(filestream* p,const tchar_t* Exts,bool_t ExtFilter,streamdir* Item)
{
    struct dirent *Dirent;

    if (!p->FindDir)
        return ERR_END_OF_FILE;

    Item->FileName[0] = 0;
    Item->Size = INVALID_FILEPOS_T;

    while (!Item->FileName[0] && (Dirent = readdir(p->FindDir)) != NULL)
    {
        tchar_t FilePath[MAXPATH];
        struct stat file_stats;

        if (Dirent->d_name[0]=='.') // skip hidden files and current directory
            continue;

        tcscpy_s(FilePath, TSIZEOF(FilePath), p->DirPath);
        tcscat_s(FilePath, TSIZEOF(FilePath), Dirent->d_name);
        tcscpy_s(Item->FileName,TSIZEOF(Item->FileName), Dirent->d_name);

        stat(FilePath, &file_stats);

        Item->ModifiedDate = LinuxToDateTime(file_stats.st_mtime);
        if (S_ISDIR(file_stats.st_mode))
        {
            Item->Type = FTYPE_DIR;
            Item->Size = INVALID_FILEPOS_T;
        }
        else
        {
            Item->Size = file_stats.st_size;
            Item->Type = CheckExts(Item->FileName,Exts);

            if (!Item->Type && ExtFilter)
                Item->FileName[0] = 0; // skip
        }
    }

    if (!Item->FileName[0])
    {
        closedir(p->FindDir);
        p->FindDir = NULL;
        return ERR_END_OF_FILE;
    }

    return ERR_NONE;
}